

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::HttpClient::Response,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>_>
::reject(AdapterPromiseNode<kj::HttpClient::Response,_kj::_::PromiseAndFulfillerAdapter<kj::HttpClient::Response>_>
         *this,Exception *exception)

{
  ExceptionOr<kj::HttpClient::Response> EStack_1e8;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&EStack_1e8,exception);
    EStack_1e8.value.ptr.isSet = false;
    ExceptionOr<kj::HttpClient::Response>::operator=(&this->result,&EStack_1e8);
    ExceptionOr<kj::HttpClient::Response>::~ExceptionOr(&EStack_1e8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }